

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringExtraTest_CopyConstructWithinInline_Test::
~MicroStringExtraTest_CopyConstructWithinInline_Test
          (MicroStringExtraTest_CopyConstructWithinInline_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(MicroStringExtraTest, CopyConstructWithinInline) {
  Arena arena;
  const size_t used = arena.SpaceUsed();
  MicroStringExtra<16> inline_str;
  constexpr absl::string_view kStr10 = "1234567890";
  ASSERT_GT(kStr10.size(), MicroString::kInlineCapacity);
  ASSERT_LE(kStr10.size(), MicroStringExtra<16>::kInlineCapacity);
  inline_str.Set(kStr10, &arena);
  EXPECT_EQ(used, arena.SpaceUsed());
  MicroStringExtra<16> copy(nullptr, inline_str);
  EXPECT_EQ(kStr10, copy.Get());
  // Should not have used any extra memory.
  EXPECT_EQ(used, arena.SpaceUsed());
  EXPECT_EQ(0, copy.SpaceUsedExcludingSelfLong());
}